

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapAsyncFunction
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  JavascriptAsyncFunction *pJVar1;
  GeneratorVirtualScriptFunction *pGVar2;
  Type *addr;
  
  pJVar1 = Js::VarTo<Js::JavascriptAsyncFunction,Js::RecyclableObject>(obj);
  if (snpObject->SnapObjectTag != SnapAsyncFunction) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  if (*snpObject->AddtlSnapObjectInfo != 0) {
    pGVar2 = (GeneratorVirtualScriptFunction *)
             InflateMap::LookupObject(inflator,*snpObject->AddtlSnapObjectInfo);
    addr = &(pJVar1->super_JavascriptGeneratorFunction).scriptFunction;
    Memory::Recycler::WBSetBit((char *)addr);
    (pJVar1->super_JavascriptGeneratorFunction).scriptFunction.ptr = pGVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    return;
  }
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapAsyncFunction(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            Js::JavascriptAsyncFunction* func = Js::VarTo<Js::JavascriptAsyncFunction>(obj);
            SnapGeneratorFunctionInfo* info = SnapObjectGetAddtlInfoAs<SnapGeneratorFunctionInfo *, SnapObjectType::SnapAsyncFunction>(snpObject);

            if (info->scriptFunction != TTD_INVALID_PTR_ID)
            {
                Js::GeneratorVirtualScriptFunction* gvsf = reinterpret_cast<Js::GeneratorVirtualScriptFunction*>(inflator->LookupObject(info->scriptFunction));
                func->SetScriptFunction(gvsf);
            }
        }